

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessDomain
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  value_t vVar3;
  json_value jVar4;
  char *pcVar5;
  Status SVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  pointer pbVar11;
  undefined1 *puVar12;
  _Alloc_hider _Var13;
  Interpreter *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  uint uVar14;
  undefined1 *puVar15;
  format_string_checker<char> *pfVar16;
  bool bVar17;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  writer write;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  domains;
  json json;
  string local_2a8;
  string *local_288;
  string *local_280;
  undefined1 local_278 [32];
  format_string_checker<char> *local_258;
  parse_func local_250 [1];
  undefined1 local_248 [8];
  _Alloc_hider local_240;
  undefined1 local_238 [24];
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  pointer local_200;
  StringArray local_1f8;
  DomainArray local_1d8;
  undefined1 local_1b8 [8];
  json_value local_1b0;
  undefined4 local_1a8;
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  Interpreter *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  undefined1 local_168 [8];
  json_value local_160;
  string local_158;
  undefined4 local_138;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  undefined4 local_110;
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  undefined4 local_c0;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [32];
  string_t local_50;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  local_280 = (string *)&(__return_storage_ptr__->mError).mMessage;
  paVar1 = &(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  local_288 = (string *)&__return_storage_ptr__->mData;
  paVar2 = &(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_dataplus._M_p = (pointer)paVar2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar11 = (aExpr->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11;
  if (uVar8 < 0x21) {
    local_278._0_8_ = (ulong)(uint)local_278._4_4_ << 0x20;
    local_278._8_8_ = "too few arguments";
    local_278._16_8_ = 0x11;
    local_278._24_8_ = 0;
    local_250[0] = (parse_func)0x0;
    pcVar10 = "too few arguments";
    local_258 = (format_string_checker<char> *)local_278;
    do {
      pcVar9 = pcVar10 + 1;
      if (*pcVar10 == '}') {
        if ((pcVar9 == "") || (*pcVar9 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar9 = pcVar10 + 2;
      }
      else if (*pcVar10 == '{') {
        pcVar9 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar10,"",(format_string_checker<char> *)local_278);
      }
      pcVar10 = pcVar9;
    } while (pcVar9 != "");
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_278;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_2a8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_98 = 2;
    puVar15 = local_80;
    local_90 = puVar15;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_2a8._M_dataplus._M_p,
               local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
    local_248._0_4_ = local_98;
    local_240._M_p = local_238 + 8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_240,local_90,local_90 + local_88);
    local_218 = 0;
    local_210._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_248._0_4_;
    local_220._M_p = (pointer)&local_210;
    std::__cxx11::string::operator=(local_280,(string *)&local_240);
    std::__cxx11::string::operator=(local_288,(string *)&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_p != &local_210) {
      operator_delete(local_220._M_p);
    }
    puVar12 = local_90;
    if (local_240._M_p != local_238 + 8) {
      operator_delete(local_240._M_p);
      puVar12 = local_90;
    }
LAB_001ba181:
    if (puVar12 != puVar15) {
      operator_delete(puVar12);
    }
  }
  else {
    if (uVar8 != 0x40) {
      local_278._0_8_ = (ulong)(uint)local_278._4_4_ << 0x20;
      local_278._8_8_ = "too many arguments";
      local_278._16_8_ = 0x12;
      local_278._24_8_ = 0;
      local_250[0] = (parse_func)0x0;
      pcVar10 = "too many arguments";
      local_258 = (format_string_checker<char> *)local_278;
      do {
        pcVar9 = pcVar10 + 1;
        if (*pcVar10 == '}') {
          if ((pcVar9 == "") || (*pcVar9 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar9 = pcVar10 + 2;
        }
        else if (*pcVar10 == '{') {
          pcVar9 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar10,"",(format_string_checker<char> *)local_278);
        }
        pcVar10 = pcVar9;
      } while (pcVar9 != "");
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_278;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_2a8,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),args_00);
      local_c0 = 2;
      puVar15 = local_a8;
      local_b8 = puVar15;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_2a8._M_dataplus._M_p,
                 local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
      local_248._0_4_ = local_c0;
      local_240._M_p = local_238 + 8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_240,local_b8,local_b8 + local_b0);
      local_218 = 0;
      local_210._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_248._0_4_;
      local_220._M_p = (pointer)&local_210;
      std::__cxx11::string::operator=(local_280,(string *)&local_240);
      std::__cxx11::string::operator=(local_288,(string *)&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_p != &local_210) {
        operator_delete(local_220._M_p);
      }
      puVar12 = local_b8;
      if (local_240._M_p != local_238 + 8) {
        operator_delete(local_240._M_p);
        puVar12 = local_b8;
      }
      goto LAB_001ba181;
    }
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    local_178 = paVar2;
    local_170 = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"list","");
    utils::ToLower((string *)local_248,pbVar11 + 1);
    utils::ToLower((string *)local_278,&local_2a8);
    if (local_240._M_p == (pointer)local_278._8_8_) {
      if (local_240._M_p == (char *)0x0) {
        bVar17 = true;
      }
      else {
        iVar7 = bcmp((void *)local_248,(void *)local_278._0_8_,(size_t)local_240._M_p);
        bVar17 = iVar7 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_);
    }
    if (local_248 != (undefined1  [8])local_238) {
      operator_delete((void *)local_248);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if (bVar17) {
      local_1b8[0] = null;
      local_1b0.object = (object_t *)0x0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_1b8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_1b8);
      local_1d8.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1d8.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pbVar11 = (this->mContext).mDomAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_200 = (this->mContext).mDomAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_180 = this;
      if (pbVar11 != local_200) {
        do {
          iVar7 = std::__cxx11::string::compare((char *)pbVar11);
          if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)pbVar11), iVar7 == 0))
          {
            local_278._0_4_ = string_type;
            local_278._8_8_ = "alias \'{}\' not supported by the command";
            local_278._16_8_ = 0x27;
            local_278._24_8_ = 0x100000000;
            local_250[0] = ::fmt::v10::detail::
                           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar10 = "alias \'{}\' not supported by the command";
            local_258 = (format_string_checker<char> *)local_278;
            local_1f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_278;
            do {
              if (pcVar10 == "") break;
              pcVar9 = pcVar10;
              if (*pcVar10 == '{') {
LAB_001ba316:
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&local_1f8,pcVar10,pcVar9);
                pcVar10 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                    (pcVar9,"",(format_string_checker<char> *)local_278);
                bVar17 = true;
              }
              else {
                pcVar9 = pcVar10 + 1;
                bVar17 = pcVar9 != "";
                if (bVar17) {
                  if (*pcVar9 != '{') {
                    pcVar5 = pcVar10 + 2;
                    do {
                      pcVar9 = pcVar5;
                      bVar17 = pcVar9 != "";
                      if (pcVar9 == "") goto LAB_001ba312;
                      pcVar5 = pcVar9 + 1;
                    } while (*pcVar9 != '{');
                  }
                  bVar17 = true;
                }
LAB_001ba312:
                if (bVar17) goto LAB_001ba316;
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&local_1f8,pcVar10,"");
                bVar17 = false;
              }
            } while (bVar17);
            local_278._0_8_ = (pbVar11->_M_dataplus)._M_p;
            local_278._8_8_ = pbVar11->_M_string_length;
            fmt.size_ = 0xd;
            fmt.data_ = (char *)0x27;
            args_01.field_1.args_ = in_R9.args_;
            args_01.desc_ = (unsigned_long_long)local_278;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_2a8,(v10 *)"alias \'{}\' not supported by the command",fmt,args_01);
            local_1a8 = 2;
            local_1a0 = local_190;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,local_2a8._M_dataplus._M_p,
                       local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
            local_248._0_4_ = local_1a8;
            local_240._M_p = local_238 + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_240,local_1a0,local_1a0 + local_198);
            local_218 = 0;
            local_210._M_local_buf[0] = '\0';
            (__return_storage_ptr__->mError).mCode = local_248._0_4_;
            local_220._M_p = (pointer)&local_210;
            std::__cxx11::string::operator=(local_280,(string *)&local_240);
            std::__cxx11::string::operator=(local_288,(string *)&local_220);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_p != &local_210) {
              operator_delete(local_220._M_p);
            }
            if (local_240._M_p != local_238 + 8) {
              operator_delete(local_240._M_p);
            }
            if (local_1a0 != local_190) {
              operator_delete(local_1a0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              operator_delete(local_2a8._M_dataplus._M_p);
            }
            uVar14 = 4;
            bVar17 = false;
          }
          else {
            uVar14 = 0;
            bVar17 = true;
          }
          if (!bVar17) goto LAB_001ba4b0;
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != local_200);
      }
      uVar14 = 7;
LAB_001ba4b0:
      if (uVar14 == 7) {
        if ((local_180->mContext).mDomAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (local_180->mContext).mDomAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          SVar6 = persistent_storage::Registry::GetAllDomains
                            ((local_180->mRegistry).
                             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,&local_1d8);
          if (SVar6 < kDataInvalid) goto LAB_001baa0f;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_04.field_1.args_ = in_R9.args_;
          args_04.desc_ = (unsigned_long_long)&local_2a8;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_278,(v10 *)"lookup failed",(string_view)ZEXT816(0xd),args_04);
          local_110 = 0x12;
          local_108 = local_f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,local_278._0_8_,
                     (char *)(local_278._8_8_ + local_278._0_8_));
          local_248._0_4_ = local_110;
          local_240._M_p = local_238 + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,local_108,local_108 + local_100);
          local_220._M_p = (pointer)&local_210;
          local_218 = 0;
          local_210._M_local_buf[0] = '\0';
          Value::operator=(__return_storage_ptr__,(Value *)local_248);
          Value::~Value((Value *)local_248);
          if (local_108 != local_f8) {
            operator_delete(local_108);
          }
          if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
            operator_delete((void *)local_278._0_8_);
          }
          uVar14 = 0;
        }
        else {
          local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          SVar6 = persistent_storage::Registry::GetDomainsByAliases
                            ((local_180->mRegistry).
                             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,&(local_180->mContext).mDomAliases,&local_1d8,&local_1f8);
          pbVar11 = local_1f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_200 = (pointer)CONCAT71(local_200._1_7_,SVar6);
          if (local_1f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_1f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pfVar16 = (format_string_checker<char> *)
                      local_1f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_158,*(long *)pfVar16,
                         (pfVar16->context_).super_basic_format_parse_context<char>.format_str_.
                         data_ + *(long *)pfVar16);
              this_00 = (Interpreter *)local_70;
              local_70._0_8_ = (pointer)(local_70 + 0x10);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_70,"failed to resolve","");
              PrintNetworkMessage(this_00,&local_158,(string *)local_70,kYellow);
              if ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10)) {
                operator_delete((void *)local_70._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p);
              }
              pfVar16 = (format_string_checker<char> *)&(pfVar16->context_).types_;
            } while (pfVar16 != (format_string_checker<char> *)pbVar11);
          }
          if ((char)local_200 != '\0') {
            local_278._0_8_ = local_278._0_8_ & 0xffffffff00000000;
            local_278._8_8_ = "lookup failed";
            local_278._16_8_ = 0xd;
            local_278._24_8_ = 0;
            local_250[0] = (parse_func)0x0;
            pcVar10 = "lookup failed";
            local_258 = (format_string_checker<char> *)local_278;
            do {
              pcVar9 = pcVar10 + 1;
              if (*pcVar10 == '}') {
                if ((pcVar9 == "") || (*pcVar9 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar9 = pcVar10 + 2;
              }
              else if (*pcVar10 == '{') {
                pcVar9 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                   (pcVar10,"",(format_string_checker<char> *)local_278);
              }
              pcVar10 = pcVar9;
            } while (pcVar9 != "");
            args_02.field_1.args_ = in_R9.args_;
            args_02.desc_ = (unsigned_long_long)local_278;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_2a8,(v10 *)"lookup failed",(string_view)ZEXT816(0xd),args_02);
            local_e8 = 0x12;
            local_e0 = local_d0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e0,local_2a8._M_dataplus._M_p,
                       local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
            local_248._0_4_ = local_e8;
            local_240._M_p = local_238 + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_240,local_e0,local_e0 + local_d8);
            local_218 = 0;
            local_210._M_local_buf[0] = '\0';
            (__return_storage_ptr__->mError).mCode = local_248._0_4_;
            local_220._M_p = (pointer)&local_210;
            std::__cxx11::string::operator=(local_280,(string *)&local_240);
            std::__cxx11::string::operator=(local_288,(string *)&local_220);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_p != &local_210) {
              operator_delete(local_220._M_p);
            }
            if (local_240._M_p != local_238 + 8) {
              operator_delete(local_240._M_p);
            }
            if (local_e0 != local_d0) {
              operator_delete(local_e0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              operator_delete(local_2a8._M_dataplus._M_p);
            }
          }
          uVar14 = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1f8);
          if ((char)local_200 == '\0') {
LAB_001baa0f:
            local_160.object = (object_t *)0x0;
            local_168[0] = array;
            local_248 = (undefined1  [8])
                        local_1d8.
                        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_278._0_8_ =
                 local_1d8.
                 super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_160.object =
                 (object_t *)
                 nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::
                 create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Domain_const*,std::vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>>,__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Domain_const*,std::vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>>>
                           ((__normal_iterator<const_ot::commissioner::persistent_storage::Domain_*,_std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>_>
                             *)local_248,
                            (__normal_iterator<const_ot::commissioner::persistent_storage::Domain_*,_std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>_>
                             *)local_278);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_168);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_168);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_168);
            jVar4 = local_1b0;
            vVar3 = local_1b8[0];
            local_1b8[0] = local_168[0];
            local_168[0] = vVar3;
            local_1b0.string = local_160.string;
            local_160 = jVar4;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_1b8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_168);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::json_value::destroy((json_value *)(local_168 + 8),local_168[0]);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::dump(&local_50,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_1b8,4,' ',false,strict);
            Value::Value((Value *)local_248,&local_50);
            (__return_storage_ptr__->mError).mCode = local_248._0_4_;
            std::__cxx11::string::operator=(local_280,(string *)&local_240);
            std::__cxx11::string::operator=(local_288,(string *)&local_220);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_p != &local_210) {
              operator_delete(local_220._M_p);
            }
            if (local_240._M_p != local_238 + 8) {
              operator_delete(local_240._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            uVar14 = 0;
          }
        }
      }
      std::
      vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ::~vector(&local_1d8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_1b8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_1b8 + 8),local_1b8[0]);
      if ((uVar14 & 3) == 0) {
        return __return_storage_ptr__;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)local_288 != local_178) {
        operator_delete(*(undefined1 **)local_288);
      }
      _Var13._M_p = (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               **)local_280;
      if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)local_280 == local_170) {
        return __return_storage_ptr__;
      }
      goto LAB_001ba199;
    }
    local_278._0_4_ = string_type;
    local_278._8_8_ = "\'{}\' is not a valid sub-command";
    local_278._16_8_ = 0x1f;
    local_278._24_8_ = 0x100000000;
    local_250[0] = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar10 = "\'{}\' is not a valid sub-command";
    local_258 = (format_string_checker<char> *)local_278;
    do {
      pcVar9 = pcVar10 + 1;
      if (*pcVar10 == '}') {
        if ((pcVar9 == "") || (*pcVar9 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar9 = pcVar10 + 2;
      }
      else if (*pcVar10 == '{') {
        pcVar9 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar10,"",(format_string_checker<char> *)local_278);
      }
      pcVar10 = pcVar9;
    } while (pcVar9 != "");
    pbVar11 = (aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_278._0_8_ = pbVar11[1]._M_dataplus._M_p;
    local_278._8_8_ = pbVar11[1]._M_string_length;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x1f;
    args_03.field_1.args_ = in_R9.args_;
    args_03.desc_ = (unsigned_long_long)local_278;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_2a8,(v10 *)"\'{}\' is not a valid sub-command",fmt_00,args_03);
    local_138 = 3;
    local_130 = local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_2a8._M_dataplus._M_p,
               local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
    local_248._0_4_ = local_138;
    local_240._M_p = local_238 + 8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_240,local_130,local_130 + local_128);
    local_218 = 0;
    local_210._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_248._0_4_;
    local_220._M_p = (pointer)&local_210;
    std::__cxx11::string::operator=(local_280,(string *)&local_240);
    std::__cxx11::string::operator=(local_288,(string *)&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_p != &local_210) {
      operator_delete(local_220._M_p);
    }
    if (local_240._M_p != local_238 + 8) {
      operator_delete(local_240._M_p);
    }
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
  }
  _Var13._M_p = local_2a8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == &local_2a8.field_2) {
    return __return_storage_ptr__;
  }
LAB_001ba199:
  operator_delete(_Var13._M_p);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessDomain(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Value value;

    VerifyOrExit(aExpr.size() > 1, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    VerifyOrExit(aExpr.size() == 2, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "list"))
    {
        RegistryStatus      status;
        nlohmann::json      json;
        std::vector<Domain> domains;

        for (const auto &alias : mContext.mDomAliases)
        {
            if (alias == ALIAS_ALL || alias == ALIAS_OTHERS)
            {
                ExitNow(value = ERROR_INVALID_ARGS("alias '{}' not supported by the command", alias));
            }
        }
        if (mContext.mDomAliases.size() != 0)
        {
            StringArray unresolved;
            status = mRegistry->GetDomainsByAliases(mContext.mDomAliases, domains, unresolved);
            for (const auto &alias : unresolved)
            {
                PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess, value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
        }
        else
        {
            status = mRegistry->GetAllDomains(domains);
            if (status != RegistryStatus::kSuccess && status != RegistryStatus::kNotFound)
            {
                ExitNow(value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
            }
        }
        json  = domains;
        value = json.dump(JSON_INDENT_DEFAULT);
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}